

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

bool __thiscall ValueSerializer::operator()(ValueSerializer *this,FILE *fp,string *value)

{
  bool bVar1;
  int iVar2;
  void *__ptr;
  size_t sVar3;
  FILE *in_RSI;
  FILE *in_RDI;
  bool bVar4;
  int size;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar2 = std::__cxx11::string::size();
  bVar1 = operator()((ValueSerializer *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_RDI,
                     (int *)0xf364ed);
  bVar4 = false;
  if (bVar1) {
    __ptr = (void *)std::__cxx11::string::c_str();
    sVar3 = fwrite(__ptr,(long)iVar2,1,in_RSI);
    bVar4 = sVar3 == 1;
  }
  return bVar4;
}

Assistant:

bool operator()(FILE* fp, const string& value) {
    const int size = value.size();
    return (*this)(fp, size) && fwrite(value.c_str(), size, 1, fp) == 1;
  }